

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotobasedialog.h
# Opt level: O0

void __thiscall Ui_GoToBaseDialog::retranslateUi(Ui_GoToBaseDialog *this,QDialog *GoToBaseDialog)

{
  QGroupBox *pQVar1;
  QLabel *pQVar2;
  QString local_70;
  QString local_58;
  QString local_30;
  QDialog *local_18;
  QDialog *GoToBaseDialog_local;
  Ui_GoToBaseDialog *this_local;
  
  local_18 = GoToBaseDialog;
  GoToBaseDialog_local = (QDialog *)this;
  QCoreApplication::translate((char *)&local_30,"GoToBaseDialog","Select item at base",0);
  QWidget::setWindowTitle((QString *)GoToBaseDialog);
  QString::~QString(&local_30);
  pQVar1 = this->groupBox;
  QString::QString(&local_58);
  QGroupBox::setTitle((QString *)pQVar1);
  QString::~QString(&local_58);
  pQVar2 = this->label;
  QCoreApplication::translate((char *)&local_70,"GoToBaseDialog","Select item at base:",0);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_70);
  return;
}

Assistant:

void retranslateUi(QDialog *GoToBaseDialog)
    {
        GoToBaseDialog->setWindowTitle(QCoreApplication::translate("GoToBaseDialog", "Select item at base", nullptr));
        groupBox->setTitle(QString());
        label->setText(QCoreApplication::translate("GoToBaseDialog", "Select item at base:", nullptr));
    }